

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

LYD_FORMAT lyd_parse_get_format(ly_in *in,LYD_FORMAT format)

{
  char *__s;
  int iVar1;
  ushort **ppuVar2;
  bool bVar3;
  ulong local_28;
  size_t len;
  char *path;
  LYD_FORMAT format_local;
  ly_in *in_local;
  
  path._4_4_ = format;
  if ((format == LYD_UNKNOWN) && (in->type == LY_IN_FILEPATH)) {
    __s = (in->method).fpath.filepath;
    local_28 = strlen(__s);
    while( true ) {
      bVar3 = false;
      if (local_28 != 0) {
        ppuVar2 = __ctype_b_loc();
        bVar3 = ((*ppuVar2)[(int)__s[local_28 - 1]] & 0x2000) != 0;
      }
      if (!bVar3) break;
      local_28 = local_28 - 1;
    }
    if ((local_28 < 5) || (iVar1 = strncmp(__s + (local_28 - 4),".xml",4), iVar1 != 0)) {
      if ((local_28 < 6) || (iVar1 = strncmp(__s + (local_28 - 5),".json",5), iVar1 != 0)) {
        if ((4 < local_28) && (iVar1 = strncmp(__s + (local_28 - 4),".lyb",4), iVar1 == 0)) {
          path._4_4_ = LYD_LYB;
        }
      }
      else {
        path._4_4_ = LYD_JSON;
      }
    }
    else {
      path._4_4_ = LYD_XML;
    }
  }
  return path._4_4_;
}

Assistant:

static LYD_FORMAT
lyd_parse_get_format(const struct ly_in *in, LYD_FORMAT format)
{
    if (!format && (in->type == LY_IN_FILEPATH)) {
        /* unknown format - try to detect it from filename's suffix */
        const char *path = in->method.fpath.filepath;
        size_t len = strlen(path);

        /* ignore trailing whitespaces */
        for ( ; len > 0 && isspace(path[len - 1]); len--) {}

        if ((len >= LY_XML_SUFFIX_LEN + 1) &&
                !strncmp(&path[len - LY_XML_SUFFIX_LEN], LY_XML_SUFFIX, LY_XML_SUFFIX_LEN)) {
            format = LYD_XML;
        } else if ((len >= LY_JSON_SUFFIX_LEN + 1) &&
                !strncmp(&path[len - LY_JSON_SUFFIX_LEN], LY_JSON_SUFFIX, LY_JSON_SUFFIX_LEN)) {
            format = LYD_JSON;
        } else if ((len >= LY_LYB_SUFFIX_LEN + 1) &&
                !strncmp(&path[len - LY_LYB_SUFFIX_LEN], LY_LYB_SUFFIX, LY_LYB_SUFFIX_LEN)) {
            format = LYD_LYB;
        } /* else still unknown */
    }

    return format;
}